

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O1

DMatrix<double> *
gmath::transpose<double>(DMatrix<double> *__return_storage_ptr__,DMatrix<double> *a)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  
  uVar1 = a->ncols;
  __return_storage_ptr__->nrows = 0;
  __return_storage_ptr__->ncols = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->v = (double *)0x0;
  DMatrix<double>::init(__return_storage_ptr__,(EVP_PKEY_CTX *)(ulong)uVar1);
  iVar2 = __return_storage_ptr__->nrows;
  if (0 < (long)iVar2) {
    uVar1 = __return_storage_ptr__->ncols;
    pdVar4 = a->v;
    iVar3 = a->ncols;
    pdVar5 = __return_storage_ptr__->v;
    lVar6 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar8 = 0;
        pdVar7 = pdVar4;
        do {
          pdVar5[uVar8] = *pdVar7;
          uVar8 = uVar8 + 1;
          pdVar7 = pdVar7 + iVar3;
        } while (uVar1 != uVar8);
      }
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + (int)uVar1;
      pdVar4 = pdVar4 + 1;
    } while (lVar6 != iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline DMatrix<T> transpose(const DMatrix<T> &a)
{
  DMatrix<T> ret(a.cols(), a.rows());

  for (int k=0; k<ret.rows(); k++)
    for (int i=0; i<ret.cols(); i++)
    {
      ret(k, i)=a(i, k);
    }

  return ret;
}